

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

void __thiscall
ser::Serializer::WriteField
          (Serializer *this,string *fieldName,Savepoint *savepoint,void *pData,int iStride,
          int jStride,int kStride,int lStride)

{
  ostringstream *this_00;
  StellaOutputProxy *pSVar1;
  SerializationException *pSVar2;
  ostream *poVar3;
  ofstream fs;
  offset_t offset;
  string checksum;
  vector<char,_std::allocator<char>_> binaryData;
  SerializationException *anon_var_0;
  undefined1 local_418 [8];
  SerializationException exception_1;
  ostringstream local_3d0 [8];
  ostringstream errorstr_1;
  int local_254;
  int savepointID;
  DataFieldInfo *info;
  undefined1 local_228 [8];
  SerializationException exception;
  ostringstream errorstr;
  string local_78;
  StellaOutput local_58;
  int jStride_local;
  int iStride_local;
  void *pData_local;
  Savepoint *savepoint_local;
  string *fieldName_local;
  Serializer *this_local;
  
  if (enabled_ < 0) {
    return;
  }
  local_58.level_ = jStride;
  local_58.maxlevel_ = iStride;
  _jStride_local = pData;
  pData_local = savepoint;
  savepoint_local = (Savepoint *)fieldName;
  fieldName_local = (string *)this;
  stella::detail::StellaOutput::operator<<(&local_58,(char (*) [15])&sout);
  pSVar1 = stella::detail::StellaOutputProxy::operator<<
                     ((StellaOutputProxy *)&local_58,&savepoint_local->name_);
  pSVar1 = stella::detail::StellaOutputProxy::operator<<(pSVar1,(char (*) [15])0x2094c6);
  Savepoint::ToString_abi_cxx11_(&local_78,(Savepoint *)pData_local);
  pSVar1 = stella::detail::StellaOutputProxy::operator<<(pSVar1,&local_78);
  pSVar1 = stella::detail::StellaOutputProxy::operator<<(pSVar1,(char (*) [15])" with data at ");
  pSVar1 = stella::detail::StellaOutputProxy::operator<<(pSVar1,(void **)&jStride_local);
  stella::detail::StellaOutputProxy::operator<<(pSVar1,(char (*) [2])0x2073e8);
  std::__cxx11::string::~string((string *)&local_78);
  if ((this->mode_ != SerializerOpenModeWrite) && (this->mode_ != SerializerOpenModeAppend)) {
    this_00 = (ostringstream *)(exception.message_.field_2._M_local_buf + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "Error: serializer not open in write mode, but write operation requested.");
    SerializationException::SerializationException((SerializationException *)local_228);
    std::__cxx11::ostringstream::str();
    SerializationException::Init((SerializationException *)local_228,(string *)&info);
    std::__cxx11::string::~string((string *)&info);
    pSVar2 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar2,(SerializationException *)local_228);
    __cxa_throw(pSVar2,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  FieldsTable::Find(&this->fieldsTable_,&savepoint_local->name_);
  local_254 = OffsetTable::GetSavepointID(&this->offsetTable_,(Savepoint *)pData_local);
  if (local_254 < 0) {
    local_254 = OffsetTable::AddNewSavepoint(&this->offsetTable_,(Savepoint *)pData_local,-1);
  }
  OffsetTable::GetOffset(&this->offsetTable_,local_254,&savepoint_local->name_);
  std::__cxx11::ostringstream::ostringstream(local_3d0);
  poVar3 = std::operator<<((ostream *)local_3d0,"Error: field ");
  poVar3 = std::operator<<(poVar3,(string *)savepoint_local);
  poVar3 = std::operator<<(poVar3," was already saved into ");
  poVar3 = std::operator<<(poVar3,"serializer at savepoint ");
  Savepoint::ToString_abi_cxx11_
            ((string *)((long)&exception_1.message_.field_2 + 8),(Savepoint *)pData_local);
  std::operator<<(poVar3,(string *)(exception_1.message_.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(exception_1.message_.field_2._M_local_buf + 8));
  SerializationException::SerializationException((SerializationException *)local_418);
  std::__cxx11::ostringstream::str();
  SerializationException::Init((SerializationException *)local_418,(string *)&anon_var_0);
  std::__cxx11::string::~string((string *)&anon_var_0);
  pSVar2 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(pSVar2,(SerializationException *)local_418);
  __cxa_throw(pSVar2,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

void Serializer::WriteField(const std::string& fieldName, const Savepoint& savepoint,
        const void* pData, int iStride, int jStride, int kStride, int lStride)
{
    // Don't write if serialization is disabeld
    if (enabled_ < 0) return;

    sout << "Writing field " << fieldName << " at savepoint " << savepoint.ToString()
         << " with data at " << pData << "\n";

    // Check open mode
    if (mode_ != SerializerOpenModeWrite && mode_ != SerializerOpenModeAppend)
    {
        // Throw exception
        std::ostringstream errorstr;
        errorstr << "Error: serializer not open in write mode, but write operation requested.";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    // Retrieve field info
    // (It will throw an exception if the field is not yet registered)
    const DataFieldInfo& info = fieldsTable_.Find(fieldName);

    // Search savepoint or add a new one if not present
    int savepointID = offsetTable_.GetSavepointID(savepoint);
    if (savepointID < 0)
        savepointID = offsetTable_.AddNewSavepoint(savepoint);

    // Check if field is already saved at savepoint
    try
    {
        offsetTable_.GetOffset(savepointID, fieldName);

        // Field is already there: throw exception
        std::ostringstream errorstr;
        errorstr << "Error: field " << fieldName << " was already saved into "
            << "serializer at savepoint " << savepoint.ToString();
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }
    catch (SerializationException&)
    {
        // Field is not there (or savepoint does not exist)
        // No error, continue
    }

    // Obtain buffer and checksum
    std::vector<char> binaryData;
    const std::string checksum = binarySerializer_.WriteArray(pData, info.bytesPerElement(),
            info.iSize(), info.jSize(), info.kSize(), info.lSize(),
            iStride, jStride, kStride, lStride, binaryData);

    // Check in offset table if data must be stored
    OffsetTable::offset_t offset;
    if (!offsetTable_.AlreadySerialized(fieldName, checksum, offset))
    {
        // Record is not found: we need to write the data
        // Open file stream
        std::ofstream fs;
        offset = pFileFormat_->OpenStreamAppend(fs, fieldName, savepoint);

        // Write data and close stream
        fs.write(binaryData.data(), binaryData.size());
        fs.close();
    }

    // Update tables
    offsetTable_.AddFieldRecord(savepointID, fieldName, offset, checksum);
    pFileFormat_->WriteTables(fieldName);
}